

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

argument * parser(argument *__return_storage_ptr__,int argc,char **argv)

{
  char *pcVar1;
  size_t sVar2;
  allocator local_35 [19];
  allocator local_22;
  undefined1 local_21;
  char **local_20;
  char **argv_local;
  argument *paStack_10;
  int argc_local;
  argument *argument;
  
  local_21 = 0;
  __return_storage_ptr__->proxy_list = argv + 2;
  __return_storage_ptr__->proxy_count = argc + -3;
  pcVar1 = argv[1];
  local_20 = argv;
  argv_local._4_4_ = argc;
  paStack_10 = __return_storage_ptr__;
  sVar2 = strlen(pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&__return_storage_ptr__->download_address,pcVar1,sVar2,&local_22);
  pcVar1 = local_20[argv_local._4_4_ + -1];
  sVar2 = strlen(pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&__return_storage_ptr__->file_name,pcVar1,sVar2,local_35);
  std::allocator<char>::~allocator((allocator<char> *)local_35);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  return __return_storage_ptr__;
}

Assistant:

argument parser(int argc, char **argv) {
    argument argument = {
            argv + 2,
            argc - 3,
            string(argv[1], strlen(argv[1])),
            string(argv[argc - 1], strlen(argv[argc - 1]))

    };
    return argument;
}